

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

cubeb_device_fmt pulse_format_to_cubeb_format(pa_sample_format_t format)

{
  pa_sample_format_t format_local;
  cubeb_device_fmt local_4;
  
  switch(format) {
  case PA_SAMPLE_S16LE:
    local_4 = CUBEB_DEVICE_FMT_S16LE;
    break;
  case PA_SAMPLE_S16BE:
    local_4 = CUBEB_DEVICE_FMT_S16BE;
    break;
  case PA_SAMPLE_FLOAT32LE:
    local_4 = CUBEB_DEVICE_FMT_F32LE;
    break;
  case PA_SAMPLE_FLOAT32BE:
    local_4 = CUBEB_DEVICE_FMT_F32BE;
    break;
  default:
    local_4 = CUBEB_DEVICE_FMT_F32LE;
  }
  return local_4;
}

Assistant:

static cubeb_device_fmt
pulse_format_to_cubeb_format(pa_sample_format_t format)
{
  switch (format) {
  case PA_SAMPLE_S16LE:
    return CUBEB_DEVICE_FMT_S16LE;
  case PA_SAMPLE_S16BE:
    return CUBEB_DEVICE_FMT_S16BE;
  case PA_SAMPLE_FLOAT32LE:
    return CUBEB_DEVICE_FMT_F32LE;
  case PA_SAMPLE_FLOAT32BE:
    return CUBEB_DEVICE_FMT_F32BE;
  default:
    return CUBEB_DEVICE_FMT_F32NE;
  }
}